

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deInt32.h
# Opt level: O0

int deClz32(deUint32 a)

{
  undefined4 local_c;
  deUint32 a_local;
  
  if (a == 0) {
    local_c = 0x20;
  }
  else {
    local_c = 0x1f;
    if (a != 0) {
      for (; a >> local_c == 0; local_c = local_c - 1) {
      }
    }
    local_c = local_c ^ 0x1f;
  }
  return local_c;
}

Assistant:

DE_INLINE int deClz32 (deUint32 a)
{
#if (DE_COMPILER == DE_COMPILER_MSC)
	unsigned long i;
	if (_BitScanReverse(&i, (unsigned long)a) == 0)
		return 32;
	else
		return 31-i;
#elif (DE_COMPILER == DE_COMPILER_GCC) || (DE_COMPILER == DE_COMPILER_CLANG)
	if (a == 0)
		return 32;
	else
		return __builtin_clz((unsigned int)a);
#else
	if ((a & 0xFF000000u) != 0)
		return (int)g_clzLUT[a >> 24];
	if ((a & 0x00FF0000u) != 0)
		return 8 + (int)g_clzLUT[a >> 16];
	if ((a & 0x0000FF00u) != 0)
		return 16 + (int)g_clzLUT[a >> 8];
	return 24 + (int)g_clzLUT[a];
#endif
}